

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

int evfilt_timer_knote_modify(filter *filt,knote *kn,kevent *kev)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  itimerspec ts;
  itimerspec local_38;
  
  lVar1 = kev->data;
  uVar2 = kev->fflags & 7;
  if (uVar2 == 1) {
    local_38.it_value.tv_nsec = 0;
    local_38.it_value.tv_sec = lVar1;
  }
  else if (uVar2 == 4) {
    local_38.it_value.tv_sec = lVar1 / 1000000000;
    local_38.it_value.tv_nsec = lVar1 % 1000000000;
  }
  else if (uVar2 == 2) {
    local_38.it_value.tv_sec = lVar1 / 1000000;
    local_38.it_value.tv_nsec = (lVar1 % 1000000) * 1000;
  }
  else {
    local_38.it_value.tv_sec = lVar1 / 1000;
    local_38.it_value.tv_nsec = (lVar1 % 1000) * 1000000;
  }
  iVar4 = 0;
  bVar5 = (kev->flags & 0x10) == 0;
  local_38.it_interval.tv_sec = 0;
  if (bVar5) {
    local_38.it_interval.tv_sec = local_38.it_value.tv_sec;
  }
  local_38.it_interval.tv_nsec = 0;
  if (bVar5) {
    local_38.it_interval.tv_nsec = local_38.it_value.tv_nsec;
  }
  iVar3 = timerfd_settime((kn->field_10).kn_timerfd,kev->fflags >> 3 & 1,&local_38,(itimerspec *)0x0
                         );
  if (iVar3 < 0) {
    iVar4 = -1;
  }
  else {
    (kn->kev).flags = kev->flags | 0x20;
    (kn->kev).fflags = kev->fflags;
    (kn->kev).data = kev->data;
  }
  return iVar4;
}

Assistant:

int
evfilt_timer_knote_modify(struct filter *filt, struct knote *kn,
        const struct kevent *kev)
{
    struct itimerspec ts;
    int flags;

    dbg_printf("timer_fd=%i - modified", kn->kn_timerfd);

    convert_timedata_to_itimerspec(&ts, kev->data, kev->fflags,
                                   kev->flags & EV_ONESHOT);
    flags = (kev->fflags & NOTE_ABSOLUTE) ? TFD_TIMER_ABSTIME : 0;
    if (timerfd_settime(kn->kn_timerfd, flags, &ts, NULL) < 0) {
        dbg_printf("timerfd_settime(2): %s", strerror(errno));
        return (-1);
    }

    kn->kev.flags = kev->flags | EV_CLEAR;
    kn->kev.fflags = kev->fflags;
    kn->kev.data = kev->data;

    return (0);
}